

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

string * cmCatViews_abi_cxx11_
                   (string *__return_storage_ptr__,
                   initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__n;
  size_type sVar1;
  const_iterator pbVar2;
  const_pointer __first;
  string_view *view_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range1_1;
  iterator sit;
  allocator<char> local_4a;
  undefined1 local_49;
  const_iterator local_48;
  string_view *view;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range1;
  size_t total_size;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_local;
  string *result;
  
  views_local._M_array = (iterator)views._M_len;
  total_size = (size_t)views._M_array;
  __range1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x0;
  __begin1 = (const_iterator)&total_size;
  views_local._M_len = (size_type)__return_storage_ptr__;
  __end1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                     ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      __begin1);
  view = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                   ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                    __begin1);
  for (; __n = __range1, __end1 != view; __end1 = __end1 + 1) {
    local_48 = __end1;
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(__end1);
    __range1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               ((long)&__range1->_M_array + sVar1);
  }
  local_49 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(size_type)__n,'\0',&local_4a);
  std::allocator<char>::~allocator(&local_4a);
  __range1_1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               std::__cxx11::string::begin();
  __end1_1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                       ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        &total_size);
  pbVar2 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                     ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      &total_size);
  for (; __end1_1 != pbVar2; __end1_1 = __end1_1 + 1) {
    __first = std::basic_string_view<char,_std::char_traits<char>_>::data(__end1_1);
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(__end1_1);
    __range1_1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 std::
                 copy_n<char_const*,unsigned_long,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           (__first,sVar1,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )__range1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCatViews(std::initializer_list<cm::string_view> views)
{
  std::size_t total_size = 0;
  for (cm::string_view const& view : views) {
    total_size += view.size();
  }

  std::string result(total_size, '\0');
  std::string::iterator sit = result.begin();
  for (cm::string_view const& view : views) {
    sit = std::copy_n(view.data(), view.size(), sit);
  }
  return result;
}